

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void lowbd_write_buffer_8xn_sse2(__m128i *in,uint8_t *output,int stride,int flipud,int height)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  ulong uVar20;
  __m128i *palVar21;
  int iVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  
  iVar22 = height + -1;
  if (flipud == 0) {
    iVar22 = 0;
  }
  uVar20 = 0;
  if (0 < height) {
    uVar20 = (ulong)(uint)height;
  }
  palVar21 = in + iVar22;
  while (bVar23 = uVar20 != 0, uVar20 = uVar20 - 1, bVar23) {
    uVar1 = *(ulong *)output;
    auVar10._8_6_ = 0;
    auVar10._0_8_ = uVar1;
    auVar10[0xe] = (char)(uVar1 >> 0x38);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xc] = (char)(uVar1 >> 0x30);
    auVar11._13_2_ = auVar10._13_2_;
    auVar12._8_4_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12._12_3_ = auVar11._12_3_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[10] = (char)(uVar1 >> 0x28);
    auVar13._11_4_ = auVar12._11_4_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._10_5_ = auVar13._10_5_;
    auVar15[8] = (char)(uVar1 >> 0x20);
    auVar15._0_8_ = uVar1;
    auVar15._9_6_ = auVar14._9_6_;
    auVar17._7_8_ = 0;
    auVar17._0_7_ = auVar15._8_7_;
    auVar18._1_8_ = SUB158(auVar17 << 0x40,7);
    auVar18[0] = (char)(uVar1 >> 0x18);
    auVar18._9_6_ = 0;
    auVar19._1_10_ = SUB1510(auVar18 << 0x30,5);
    auVar19[0] = (char)(uVar1 >> 0x10);
    auVar19._11_4_ = 0;
    auVar16[2] = (char)(uVar1 >> 8);
    auVar16._0_2_ = (ushort)uVar1;
    auVar16._3_12_ = SUB1512(auVar19 << 0x20,3);
    auVar24._0_2_ = (ushort)uVar1 & 0xff;
    auVar24._2_13_ = auVar16._2_13_;
    auVar24[0xf] = 0;
    auVar24 = paddsw(auVar24,(undefined1  [16])*palVar21);
    sVar2 = auVar24._0_2_;
    sVar3 = auVar24._2_2_;
    sVar4 = auVar24._4_2_;
    sVar5 = auVar24._6_2_;
    sVar6 = auVar24._8_2_;
    sVar7 = auVar24._10_2_;
    sVar8 = auVar24._12_2_;
    sVar9 = auVar24._14_2_;
    *(ulong *)output =
         CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar24[0xe] - (0xff < sVar9),
                  CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar24[0xc] - (0xff < sVar8),
                           CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar24[10] - (0xff < sVar7),
                                    CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar24[8] -
                                             (0xff < sVar6),
                                             CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar24[6] -
                                                      (0xff < sVar5),
                                                      CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                               auVar24[4] - (0xff < sVar4),
                                                               CONCAT11((0 < sVar3) *
                                                                        (sVar3 < 0x100) * auVar24[2]
                                                                        - (0xff < sVar3),
                                                                        (0 < sVar2) *
                                                                        (sVar2 < 0x100) * auVar24[0]
                                                                        - (0xff < sVar2))))))));
    palVar21 = palVar21 + (ulong)(flipud == 0) * 2 + -1;
    output = (uint8_t *)((long)output + (long)stride);
  }
  return;
}

Assistant:

static inline void lowbd_write_buffer_8xn_sse2(__m128i *in, uint8_t *output,
                                               int stride, int flipud,
                                               const int height) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    const __m128i v = _mm_loadl_epi64((__m128i const *)(output + i * stride));
    const __m128i u = lowbd_get_recon_8x8_sse2(v, in[j]);
    _mm_storel_epi64((__m128i *)(output + i * stride), u);
  }
}